

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O1

void __thiscall
feintrack::SimpleLeftObjectsDetector::add_left_object_to_out_rects
          (SimpleLeftObjectsDetector *this,CLeftObjView *left_obj,types type,
          VideoHeader *videoHeader)

{
  pointer *ppCVar1;
  int *piVar2;
  int iVar3;
  size_t sVar4;
  pointer pCVar5;
  iterator __position;
  pointer pCVar6;
  CLeftObjRect local_38;
  
  sVar4 = this->left_objects_count;
  this->left_objects_count = sVar4 + 1;
  pCVar5 = (this->left_obj_rects).
           super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->left_obj_rects).
       super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if ((ulong)(((long)__position._M_current - (long)pCVar5 >> 3) * -0x5555555555555555) < sVar4 + 1)
  {
    local_38.obj_uid = left_obj->obj_uid;
    local_38.super_RECT_.left = (left_obj->rect).left;
    local_38.super_RECT_.right = (left_obj->rect).right;
    local_38.super_RECT_.top = (left_obj->rect).top;
    local_38.super_RECT_.bottom = (left_obj->rect).bottom;
    if (__position._M_current ==
        (this->left_obj_rects).
        super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.type = type;
      std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
      _M_realloc_insert<feintrack::CLeftObjRect>(&this->left_obj_rects,__position,&local_38);
    }
    else {
      (__position._M_current)->type = type;
      (__position._M_current)->obj_uid = local_38.obj_uid;
      ((__position._M_current)->super_RECT_).left = local_38.super_RECT_.left;
      ((__position._M_current)->super_RECT_).right = local_38.super_RECT_.right;
      ((__position._M_current)->super_RECT_).top = local_38.super_RECT_.top;
      ((__position._M_current)->super_RECT_).bottom = local_38.super_RECT_.bottom;
      ppCVar1 = &(this->left_obj_rects).
                 super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    iVar3 = videoHeader->left_padding;
    if (iVar3 != 0) {
      pCVar6 = (this->left_obj_rects).
               super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = this->left_objects_count;
      pCVar5 = pCVar6 + (sVar4 - 1);
      (pCVar5->super_RECT_).left = (pCVar5->super_RECT_).left + iVar3;
      piVar2 = &pCVar6[sVar4 - 1].super_RECT_.right;
      *piVar2 = *piVar2 + iVar3;
    }
    iVar3 = videoHeader->top_padding;
    if (iVar3 != 0) {
      pCVar5 = (this->left_obj_rects).
               super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = this->left_objects_count;
      piVar2 = &pCVar5[sVar4 - 1].super_RECT_.top;
      *piVar2 = *piVar2 + iVar3;
      piVar2 = &pCVar5[sVar4 - 1].super_RECT_.bottom;
      *piVar2 = *piVar2 + iVar3;
    }
  }
  else {
    iVar3 = videoHeader->left_padding;
    pCVar5[sVar4].super_RECT_.left = (left_obj->rect).left + iVar3;
    pCVar5[sVar4].super_RECT_.right = iVar3 + (left_obj->rect).right;
    iVar3 = videoHeader->top_padding;
    pCVar5[sVar4].super_RECT_.top = (left_obj->rect).top + iVar3;
    pCVar5[sVar4].super_RECT_.bottom = iVar3 + (left_obj->rect).bottom;
    pCVar5[sVar4].type = type;
    pCVar5[sVar4].obj_uid = left_obj->obj_uid;
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::add_left_object_to_out_rects(
        const CLeftObjView &left_obj,
        CLeftObjRect::types type,
        const VideoHeader& videoHeader
        )
{
    // Здесь сделана попытка избежать лишних выделений памяти: массив left_obj_rects никогда не уменьшается
    // Он может только увеличивать свой размер, если на последующих кадрах выделенных объектов больше, чем на предыдущих
    if (++left_objects_count > left_obj_rects.size())
    {
        left_obj_rects.push_back(CLeftObjRect(left_obj.rect, type, left_obj.obj_uid));
        if (videoHeader.left_padding)
        {
            left_obj_rects[left_objects_count - 1].left += videoHeader.left_padding;
            left_obj_rects[left_objects_count - 1].right += videoHeader.left_padding;
        }
        if (videoHeader.top_padding)
        {
            left_obj_rects[left_objects_count - 1].top += videoHeader.top_padding;
            left_obj_rects[left_objects_count - 1].bottom += videoHeader.top_padding;
        }
    }
    else
    {
        left_obj_rects[left_objects_count - 1].left = left_obj.rect.left + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].right = left_obj.rect.right + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].top = left_obj.rect.top + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].bottom = left_obj.rect.bottom + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].type = type;
        left_obj_rects[left_objects_count - 1].obj_uid = left_obj.obj_uid;
    }
}